

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readComment(Reader *this)

{
  bool bVar1;
  bool bVar2;
  Location pCVar3;
  Char CVar4;
  CommentPlacement placement;
  
  pCVar3 = this->current_;
  if (pCVar3 == this->end_) {
    CVar4 = '\0';
  }
  else {
    this->current_ = pCVar3 + 1;
    CVar4 = *pCVar3;
  }
  if (CVar4 == '/') {
    readCppStyleComment(this);
    bVar1 = true;
  }
  else if (CVar4 == '*') {
    bVar1 = readCStyleComment(this);
  }
  else {
    bVar1 = false;
  }
  if (bVar1 != false) {
    if (this->collectComments_ == true) {
      pCVar3 = pCVar3 + -1;
      placement = commentBefore;
      if (((this->lastValueEnd_ != (Location)0x0) &&
          (bVar2 = containsNewLine(this->lastValueEnd_,pCVar3), placement = commentBefore, !bVar2))
         && ((CVar4 != '*' || (bVar2 = containsNewLine(pCVar3,this->current_), !bVar2)))) {
        placement = commentAfterOnSameLine;
      }
      addComment(this,pCVar3,this->current_,placement);
      return bVar1;
    }
    return bVar1;
  }
  return bVar1;
}

Assistant:

bool Reader::readComment() {
  Location commentBegin = current_ - 1;
  Char c = getNextChar();
  bool successful = false;
  if (c == '*')
    successful = readCStyleComment();
  else if (c == '/')
    successful = readCppStyleComment();
  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;
    if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
      if (c != '*' || !containsNewLine(commentBegin, current_))
        placement = commentAfterOnSameLine;
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}